

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall
helics::CommonCore::processCommandInstruction(CommonCore *this,ActionMessage *command)

{
  string_view message;
  string_view str;
  string_view name;
  bool bVar1;
  type_conflict *ptVar2;
  type *this_00;
  long in_RSI;
  CommonCore *in_RDI;
  __sv_type _Var3;
  ActionMessage warn;
  string warnString;
  type *res;
  type_conflict *processed;
  ActionMessage *in_stack_00000218;
  BrokerBase *in_stack_00000220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffdf8;
  undefined1 in_stack_fffffffffffffe08 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *u;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 uVar4;
  GlobalBrokerId id;
  GlobalFederateId in_stack_fffffffffffffe24;
  ActionMessage *pAStack_110;
  GlobalFederateId local_f0 [4];
  char *local_e0;
  undefined8 local_d8;
  undefined1 local_d0 [27];
  undefined1 in_stack_ffffffffffffff4b;
  int in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  GlobalFederateId in_stack_ffffffffffffff6c;
  undefined1 local_68 [16];
  undefined8 local_58;
  undefined1 *local_50;
  char *local_48;
  undefined8 uStack_40;
  reference local_30;
  char *local_28;
  undefined8 uStack_20;
  undefined1 *local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  
  BrokerBase::processBaseCommands(in_stack_00000220,in_stack_00000218);
  ptVar2 = std::
           get<0ul,bool,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>
                     ((pair<bool,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                       *)0x49edaa);
  this_00 = std::
            get<1ul,bool,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>
                      ((pair<bool,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                        *)0x49edbf);
  if ((*ptVar2 & 1U) == 0) {
    local_e0 = "Unrecognized command instruction \"{}\"";
    local_d8 = 0x25;
    local_30 = CLI::std::
               vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ::operator[]((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                             *)this_00,0);
    local_18 = local_d0;
    local_28 = local_e0;
    uStack_20 = local_d8;
    local_48 = local_e0;
    uStack_40 = local_d8;
    ::fmt::v11::detail::value<fmt::v11::context>::
    value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
              ((value<fmt::v11::context> *)in_RDI,in_stack_fffffffffffffdf8);
    local_8 = &local_58;
    local_10 = local_68;
    local_58 = 0xd;
    local_50 = local_10;
    ::fmt::v11::vformat_abi_cxx11_((string_view)warn._32_16_,(format_args)warn._16_16_);
    GlobalFederateId::GlobalFederateId
              (local_f0,(GlobalBrokerId)(in_RDI->super_BrokerBase).global_broker_id_local.gid);
    getIdentifier_abi_cxx11_(in_RDI);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffdf0);
    _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffdf0);
    pAStack_110 = (ActionMessage *)_Var3._M_str;
    name._M_str = ptVar2;
    name._M_len = (size_t)this_00;
    message._M_str = (char *)warn.payload.buffer._M_elems._24_8_;
    message._M_len = warn.payload.buffer._M_elems._16_8_;
    BrokerBase::sendToLogger
              ((BrokerBase *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff6c,in_stack_ffffffffffffff4c,name,message,
               (bool)in_stack_ffffffffffffff4b);
    bVar1 = GlobalFederateId::operator!=
                      ((GlobalFederateId *)(in_RSI + 8),
                       (GlobalBrokerId)(in_RDI->super_BrokerBase).global_broker_id_local.gid);
    if (bVar1) {
      id.gid = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
      GlobalFederateId::GlobalFederateId((GlobalFederateId *)&stack0xfffffffffffffe24,id);
      u = in_stack_fffffffffffffe08._8_8_;
      uVar4 = *(undefined4 *)(in_RSI + 8);
      ActionMessage::ActionMessage
                (in_stack_fffffffffffffe08._0_8_,(action_t)((ulong)in_RDI >> 0x20),
                 (GlobalFederateId)in_stack_fffffffffffffe08._12_4_,
                 (GlobalFederateId)in_stack_fffffffffffffe08._8_4_);
      SmallBuffer::operator=((SmallBuffer *)CONCAT44(uVar4,in_stack_fffffffffffffe18),u);
      getIdentifier_abi_cxx11_(in_RDI);
      _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pAStack_110);
      str._M_len._4_4_ = uVar4;
      str._M_len._0_4_ = in_stack_fffffffffffffe18;
      str._M_str._0_4_ = id.gid;
      str._M_str._4_4_ = in_stack_fffffffffffffe24.gid;
      ActionMessage::setString((ActionMessage *)_Var3._M_str,_Var3._M_len._4_4_,str);
      routeMessage((CommonCore *)warn.payload.buffer._M_elems._16_8_,
                   (ActionMessage *)warn.payload.buffer._M_elems._8_8_);
      ActionMessage::~ActionMessage(pAStack_110);
    }
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAStack_110);
  }
  std::
  pair<bool,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  ::~pair((pair<bool,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
           *)0x49f0d5);
  return;
}

Assistant:

void CommonCore::processCommandInstruction(ActionMessage& command)
{
    auto [processed, res] = processBaseCommands(command);
    if (processed) {
        return;
    }
    auto warnString = fmt::format("Unrecognized command instruction \"{}\"", res[0]);
    LOG_WARNING(global_broker_id_local, getIdentifier(), warnString);
    if (command.source_id != global_broker_id_local) {
        ActionMessage warn(CMD_WARNING, global_broker_id_local, command.source_id);
        warn.payload = std::move(warnString);
        warn.messageID = HELICS_LOG_LEVEL_WARNING;
        warn.setString(0, getIdentifier());
        routeMessage(warn);
    }
}